

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O2

void my_numbox_key(void *z,t_symbol *keysym,t_floatarg fkey)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  double dVar6;
  char buf [3];
  
  buf[1] = '\0';
  cVar5 = (char)(int)fkey;
  if (cVar5 == '\0') {
    *(byte *)((long)z + 0x443) = *(byte *)((long)z + 0x443) & 0xf7;
    goto LAB_00149bd3;
  }
  if (9 < (byte)(cVar5 - 0x30U)) {
    uVar2 = (int)fkey & 0xff;
    uVar4 = (ulong)(uVar2 - 8);
    if (uVar2 - 8 < 0x3e) {
      if ((0x2000006800000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x24UL >> (uVar4 & 0x3f) & 1) != 0) {
          if (*(char *)((long)z + 0x4c4) != '\0') {
            dVar6 = atof((char *)((long)z + 0x4c4));
            *(float *)((long)z + 0x4a0) = (float)dVar6;
            *(undefined1 *)((long)z + 0x4c4) = 0;
            if (pd_compatibilitylevel < 0x35) {
              my_numbox_clip((t_my_numbox *)z);
            }
            sys_queuegui(z,*(_glist **)((long)z + 0x30),my_numbox_draw_update);
          }
          my_numbox_bang((t_my_numbox *)z);
          return;
        }
        if (uVar4 != 0) goto LAB_00149c5d;
        goto LAB_00149c75;
      }
    }
    else {
LAB_00149c5d:
      if (uVar2 == 0x7f) {
LAB_00149c75:
        sVar3 = strlen((char *)((long)z + 0x4c4));
        iVar1 = 1;
        if (1 < (int)sVar3) {
          iVar1 = (int)sVar3;
        }
        *(undefined1 *)((long)z + (ulong)(iVar1 - 1) + 0x4c4) = 0;
        goto LAB_00149bd3;
      }
      if (uVar2 != 0x65) {
        return;
      }
    }
  }
  sVar3 = strlen((char *)((long)z + 0x4c4));
  if (0x1d < sVar3) {
    return;
  }
  buf[0] = cVar5;
  strcat((char *)((long)z + 0x4c4),buf);
LAB_00149bd3:
  sys_queuegui(z,*(_glist **)((long)z + 0x30),my_numbox_draw_update);
  return;
}

Assistant:

static void my_numbox_key(void *z, t_symbol *keysym, t_floatarg fkey)
{
    t_my_numbox *x = z;
    char c = fkey;
    char buf[3];
    buf[1] = 0;

    if(c == 0)
    {
        x->x_gui.x_fsf.x_change = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        return;
    }
    if(((c >= '0') && (c <= '9')) || (c == '.') || (c == '-') ||
        (c == 'e') || (c == '+') || (c == 'E'))
    {
        if(strlen(x->x_buf) < (IEMGUI_MAX_NUM_LEN-2))
        {
            buf[0] = c;
            strcat(x->x_buf, buf);
            sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        }
    }
    else if((c == '\b') || (c == 127))
    {
        int sl = (int)strlen(x->x_buf) - 1;

        if(sl < 0)
            sl = 0;
        x->x_buf[sl] = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
    else if((c == '\n') || (c == 13))
    {
        if(x->x_buf[0])
        {
            x->x_val = atof(x->x_buf);
            x->x_buf[0] = 0;
            if (pd_compatibilitylevel < 53)
                my_numbox_clip(x);
            sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        }
        my_numbox_bang(x);
    }
}